

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

TranslationBlock_conflict *
tb_gen_code_riscv32(CPUState_conflict *cpu,target_ulong_conflict pc,target_ulong_conflict cs_base,
                   uint32_t flags,int cflags)

{
  ushort uVar1;
  TCGContext_conflict9 *s;
  CPUArchState_conflict25 *env;
  void *pvVar2;
  TCGContext_conflict9 *pTVar3;
  uint8_t *puVar4;
  uc_struct_conflict5 *uc;
  tb_page_addr_t phys1;
  uint32_t hash;
  TranslationBlock_conflict *tb;
  uint8_t *p_00;
  tb_page_addr_t phys2;
  bool bVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  TranslationBlock_conflict *pTVar10;
  uint local_ac;
  PageDesc *p2;
  uint32_t local_7c;
  target_ulong_conflict local_78;
  uint32_t local_74;
  void *local_70;
  PageDesc *p;
  CPUArchState_conflict25 *local_60;
  tb_page_addr_t local_58;
  uint8_t *local_50;
  size_t local_48;
  CPUState_conflict *local_40;
  TranslationBlock_conflict *local_38;
  
  s = cpu->uc->tcg_ctx;
  env = (CPUArchState_conflict25 *)cpu->env_ptr;
  local_78 = cs_base;
  local_74 = flags;
  local_58 = get_page_addr_code_riscv32(env,pc);
  uVar8 = cflags | 0x10000;
  if (local_58 != 0xffffffffffffffff) {
    uVar8 = cflags;
  }
  local_7c = cpu->cluster_index << 0x18 | uVar8 & 0xffffff;
  uVar8 = uVar8 & 0x7fff;
  uVar7 = 0x200;
  if (uVar8 < 0x200) {
    uVar7 = uVar8;
  }
  if (uVar8 == 0) {
    uVar7 = 0x200;
  }
  local_ac = 1;
  if (cpu->singlestep_enabled == 0) {
    local_ac = uVar7;
  }
  local_40 = (CPUState_conflict *)(env[-0x26].pmp_state.pmp + 5);
  local_60 = env;
LAB_00a63d2e:
  do {
    tb = tcg_tb_alloc_riscv32(s);
    if (tb == (TranslationBlock_conflict *)0x0) {
      tb_flush_riscv32(cpu);
      cpu->exception_index = 0x10000;
      cpu_loop_exit_riscv32(cpu);
    }
    pvVar2 = s->code_gen_ptr;
    (tb->tc).ptr = pvVar2;
    tb->pc = pc;
    tb->cs_base = local_78;
    tb->flags = local_74;
    tb->cflags = local_7c;
    tb->orig_tb = (TranslationBlock_conflict *)0x0;
    tb->trace_vcpu_dstate = (uint32_t)cpu->trace_dstate[0];
    s->tb_cflags = local_7c;
    while( true ) {
      tcg_func_start_riscv32(s);
      s->cpu = local_40;
      gen_intermediate_code_riscv32(cpu,tb,local_ac);
      s->cpu = (CPUState_conflict *)0x0;
      tb->jmp_reset_offset[0] = 0xffff;
      tb->jmp_reset_offset[1] = 0xffff;
      s->tb_jmp_reset_offset = tb->jmp_reset_offset;
      s->tb_jmp_insn_offset = tb->jmp_target_arg;
      s->tb_jmp_target_addr = (uintptr_t *)0x0;
      uVar8 = tcg_gen_code_riscv32(s,tb);
      if (-1 < (int)uVar8) break;
      if (uVar8 != 0xfffffffe) {
        if (uVar8 != 0xffffffff) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                     ,0x711,(char *)0x0);
        }
        goto LAB_00a63d2e;
      }
      local_ac = (uint)(tb->icount >> 1);
      if (tb->icount < 2) {
        __assert_fail("max_insns > 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                      ,0x70c,
                      "TranslationBlock *tb_gen_code_riscv32(CPUState *, target_ulong, target_ulong, uint32_t, int)"
                     );
      }
    }
    local_48 = (size_t)uVar8;
    p_00 = (uint8_t *)(local_48 + (long)pvVar2);
    pTVar3 = cpu->uc->tcg_ctx;
    puVar4 = (uint8_t *)pTVar3->code_gen_highwater;
    uVar1 = tb->icount;
    uVar9 = 0;
    local_70 = pvVar2;
    local_50 = p_00;
    do {
      if (uVar9 == uVar1) {
        uVar8 = (int)p_00 - (int)local_50;
        if (-1 < (int)uVar8) {
          (tb->tc).size = local_48;
          s->code_gen_ptr =
               (void *)((long)local_70 + (uVar8 & 0x7fffffff) + local_48 + 0xf & 0xfffffffffffffff0)
          ;
          tb->jmp_dest[1] = 0;
          *(undefined1 (*) [16])(tb->jmp_list_next + 1) = (undefined1  [16])0x0;
          tb->jmp_list_head = 0;
          tb->jmp_list_next[0] = 0;
          if (tb->jmp_reset_offset[0] != 0xffff) {
            tb_reset_jump(tb,0);
          }
          phys1 = local_58;
          if (tb->jmp_reset_offset[1] != 0xffff) {
            tb_reset_jump(tb,1);
          }
          uVar8 = (pc + tb->size) - 1 & 0xfffff000;
          if ((pc & 0xfffff000) == uVar8) {
            phys2 = 0xffffffffffffffff;
          }
          else {
            phys2 = get_page_addr_code_riscv32(local_60,uVar8);
          }
          uc = (uc_struct_conflict5 *)cpu->uc;
          p2 = (PageDesc *)0x0;
          if (phys1 == 0xffffffffffffffff) {
            if ((tb->cflags & 0x10000) == 0) {
              __assert_fail("tb->cflags & CF_NOCACHE",
                            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                            ,0x66c,
                            "TranslationBlock *tb_link_page(struct uc_struct *, TranslationBlock *, tb_page_addr_t, tb_page_addr_t)"
                           );
            }
            *(undefined4 *)tb->page_addr = 0xffffffff;
            *(undefined4 *)((long)tb->page_addr + 4) = 0xffffffff;
            *(undefined4 *)(tb->page_addr + 1) = 0xffffffff;
            *(undefined4 *)((long)tb->page_addr + 0xc) = 0xffffffff;
          }
          else {
            page_lock_pair((uc_struct_conflict12 *)uc,&p,phys1,&p2,phys2,1);
            tb_page_add((uc_struct_conflict12 *)uc,p,tb,0,(ulong)((uint)phys1 & 0xfffff000));
            if (p2 == (PageDesc *)0x0) {
              tb->page_addr[1] = 0xffffffffffffffff;
            }
            else {
              tb_page_add((uc_struct_conflict12 *)uc,p2,tb,1,phys2);
            }
            if ((tb->cflags >> 0x10 & 1) == 0) {
              local_38 = (TranslationBlock_conflict *)0x0;
              hash = tb_hash_func(phys1,tb->pc,tb->flags,tb->cflags & 0xff0affff,
                                  tb->trace_vcpu_dstate);
              tb->hash = hash;
              qht_insert(uc,(qht *)(uc->tcg_ctx->gen_insn_data[0xaa] + 2),tb,hash,&local_38);
              if (local_38 != (TranslationBlock_conflict *)0x0) {
                tb_page_remove(p,tb);
                invalidate_page_bitmap(p);
                if (p2 != (PageDesc *)0x0) {
                  tb_page_remove(p2,tb);
                  invalidate_page_bitmap(p2);
                }
                if (local_38 != tb) {
                  lVar6 = (long)s->uc->qemu_icache_linesize;
                  s->code_gen_ptr = (void *)((long)local_70 - (-lVar6 & lVar6 + 0x97U));
                  return local_38;
                }
              }
            }
          }
          tcg_tb_insert_riscv32(s,tb);
          return tb;
        }
        break;
      }
      pTVar10 = (TranslationBlock_conflict *)(pTVar3->gen_insn_data + (uVar9 - 1));
      if (uVar9 == 0) {
        pTVar10 = tb;
      }
      bVar5 = true;
      while (bVar5) {
        p_00 = encode_sleb128(p_00,pTVar3->gen_insn_data[uVar9][0] - pTVar10->pc);
        bVar5 = false;
      }
      if (uVar9 == 0) {
        uVar8 = 0;
      }
      else {
        uVar8 = (uint)pTVar3->gen_insn_end_off[uVar9 - 1];
      }
      p_00 = encode_sleb128(p_00,pTVar3->gen_insn_end_off[uVar9] - uVar8);
      uVar9 = uVar9 + 1;
    } while (p_00 <= puVar4);
  } while( true );
}

Assistant:

TranslationBlock *tb_gen_code(CPUState *cpu,
                              target_ulong pc, target_ulong cs_base,
                              uint32_t flags, int cflags)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    TCGContext *tcg_ctx = cpu->uc->tcg_ctx;
    CPUArchState *env = cpu->env_ptr;
    TranslationBlock *tb, *existing_tb;
    tb_page_addr_t phys_pc, phys_page2;
    target_ulong virt_page2;
    tcg_insn_unit *gen_code_buf;
    int gen_code_size, search_size, max_insns;

    assert_memory_lock();
#ifdef HAVE_PTHREAD_JIT_PROTECT
    tb_exec_unlock(tcg_ctx);
#endif
    phys_pc = get_page_addr_code(env, pc);

    if (phys_pc == -1) {
        /* Generate a temporary TB; do not cache */
        cflags |= CF_NOCACHE;
    }

    cflags &= ~CF_CLUSTER_MASK;
    cflags |= ((uint32_t)cpu->cluster_index) << CF_CLUSTER_SHIFT;

    max_insns = cflags & CF_COUNT_MASK;
    if (max_insns == 0) {
        max_insns = CF_COUNT_MASK;
    }
    if (max_insns > TCG_MAX_INSNS) {
        max_insns = TCG_MAX_INSNS;
    }
    if (cpu->singlestep_enabled) {
        max_insns = 1;
    }

 buffer_overflow:
    tb = tcg_tb_alloc(tcg_ctx);
    if (unlikely(!tb)) {
        /* flush must be done */
        tb_flush(cpu);
        mmap_unlock();
        /* Make the execution loop process the flush as soon as possible.  */
        cpu->exception_index = EXCP_INTERRUPT;
        cpu_loop_exit(cpu);
    }

    gen_code_buf = tcg_ctx->code_gen_ptr;
    tb->tc.ptr = gen_code_buf;
    tb->pc = pc;
    tb->cs_base = cs_base;
    tb->flags = flags;
    tb->cflags = cflags;
    tb->orig_tb = NULL;
    tb->trace_vcpu_dstate = *cpu->trace_dstate;
    tcg_ctx->tb_cflags = cflags;
 tb_overflow:

    tcg_func_start(tcg_ctx);

    tcg_ctx->cpu = env_cpu(env);
    UC_TRACE_START(UC_TRACE_TB_TRANS);
    gen_intermediate_code(cpu, tb, max_insns);
    UC_TRACE_END(UC_TRACE_TB_TRANS, "[uc] translate tb 0x%" PRIx64 ": ", tb->pc);
    tcg_ctx->cpu = NULL;

    /* generate machine code */
    tb->jmp_reset_offset[0] = TB_JMP_RESET_OFFSET_INVALID;
    tb->jmp_reset_offset[1] = TB_JMP_RESET_OFFSET_INVALID;
    tcg_ctx->tb_jmp_reset_offset = tb->jmp_reset_offset;
    if (TCG_TARGET_HAS_direct_jump) {
        tcg_ctx->tb_jmp_insn_offset = tb->jmp_target_arg;
        tcg_ctx->tb_jmp_target_addr = NULL;
    } else {
        tcg_ctx->tb_jmp_insn_offset = NULL;
        tcg_ctx->tb_jmp_target_addr = tb->jmp_target_arg;
    }

    gen_code_size = tcg_gen_code(tcg_ctx, tb);
    if (unlikely(gen_code_size < 0)) {
        switch (gen_code_size) {
        case -1:
            /*
             * Overflow of code_gen_buffer, or the current slice of it.
             *
             * TODO: We don't need to re-do gen_intermediate_code, nor
             * should we re-do the tcg optimization currently hidden
             * inside tcg_gen_code.  All that should be required is to
             * flush the TBs, allocate a new TB, re-initialize it per
             * above, and re-do the actual code generation.
             */
            goto buffer_overflow;

        case -2:
            /*
             * The code generated for the TranslationBlock is too large.
             * The maximum size allowed by the unwind info is 64k.
             * There may be stricter constraints from relocations
             * in the tcg backend.
             *
             * Try again with half as many insns as we attempted this time.
             * If a single insn overflows, there's a bug somewhere...
             */
            max_insns = tb->icount;
            assert(max_insns > 1);
            max_insns /= 2;
            goto tb_overflow;

        default:
            g_assert_not_reached();
        }
    }
    search_size = encode_search(cpu->uc, tb, (uint8_t *)gen_code_buf + gen_code_size);
    if (unlikely(search_size < 0)) {
        goto buffer_overflow;
    }
    tb->tc.size = gen_code_size;

    tcg_ctx->code_gen_ptr = (void *)
        ROUND_UP((uintptr_t)gen_code_buf + gen_code_size + search_size,
                 CODE_GEN_ALIGN);

    /* init jump list */
    tb->jmp_list_head = (uintptr_t)NULL;
    tb->jmp_list_next[0] = (uintptr_t)NULL;
    tb->jmp_list_next[1] = (uintptr_t)NULL;
    tb->jmp_dest[0] = (uintptr_t)NULL;
    tb->jmp_dest[1] = (uintptr_t)NULL;

    /* init original jump addresses which have been set during tcg_gen_code() */
    if (tb->jmp_reset_offset[0] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 0);
    }
    if (tb->jmp_reset_offset[1] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 1);
    }

    /* check next page if needed */
    virt_page2 = (pc + tb->size - 1) & TARGET_PAGE_MASK;
    phys_page2 = -1;
    if ((pc & TARGET_PAGE_MASK) != virt_page2) {
        phys_page2 = get_page_addr_code(env, virt_page2);
    }
    /*
     * No explicit memory barrier is required -- tb_link_page() makes the
     * TB visible in a consistent state.
     */
    existing_tb = tb_link_page(cpu->uc, tb, phys_pc, phys_page2);
    /* if the TB already exists, discard what we just translated */
    if (unlikely(existing_tb != tb)) {
        uintptr_t orig_aligned = (uintptr_t)gen_code_buf;

        orig_aligned -= ROUND_UP(sizeof(*tb), tcg_ctx->uc->qemu_icache_linesize);
        tcg_ctx->code_gen_ptr = (void *)orig_aligned;
        return existing_tb;
    }
    tcg_tb_insert(tcg_ctx, tb);
    return tb;
}